

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

int __thiscall Fl_Table::is_selected(Fl_Table *this,int r,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = this->select_col;
  iVar2 = this->current_col;
  iVar4 = iVar2;
  if (iVar1 < iVar2) {
    iVar4 = iVar1;
  }
  iVar3 = this->current_row;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  iVar1 = this->select_row;
  iVar5 = iVar3;
  if (iVar1 < iVar3) {
    iVar5 = iVar1;
  }
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  return (int)((c <= iVar2 && iVar4 <= c) && (r <= iVar3 && iVar5 <= r));
}

Assistant:

int Fl_Table::is_selected(int r, int c) {
  int s_left, s_right, s_top, s_bottom;
  
  if (select_col > current_col) {
    s_left = current_col;
    s_right = select_col;
  } else {
    s_right = current_col;
    s_left = select_col;
  }
  if (select_row > current_row) {
    s_top = current_row;
    s_bottom = select_row;
  } else {
    s_bottom = current_row;
    s_top = select_row;
  }
  if (r >= s_top && r <= s_bottom && c >= s_left && c <= s_right) {
    return 1;
  }
  return 0;
}